

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::report_bad_alloc_error(char *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  lock_guard<std::mutex> lVar2;
  size_t __n;
  ssize_t written;
  char OOMMessage [27];
  allocator local_51;
  string local_50;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> Lock;
  void *HandlerData;
  fatal_error_handler_t Handler;
  bool GenCrashDiag_local;
  char *Reason_local;
  
  Lock._M_device = (mutex_type *)0x0;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&BadAllocErrorHandlerMutex);
  p_Var1 = BadAllocErrorHandler_abi_cxx11_;
  Lock._M_device = (mutex_type *)BadAllocErrorHandlerUserData;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  lVar2 = Lock;
  if (p_Var1 != (fatal_error_handler_t)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,Reason,&local_51);
    (*p_Var1)(lVar2._M_device,&local_50,GenCrashDiag);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    llvm_unreachable_internal
              ("bad alloc handler should not return",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ErrorHandling.cpp"
               ,0xa2);
  }
  written._0_1_ = 'L';
  written._1_1_ = 'L';
  written._2_1_ = 'V';
  written._3_1_ = 'M';
  written._4_1_ = ' ';
  written._5_1_ = 'E';
  written._6_1_ = 'R';
  written._7_1_ = 'R';
  builtin_strncpy(OOMMessage,"OR: out of memory\n",0x13);
  __n = strlen((char *)&written);
  write(2,&written,__n);
  abort();
}

Assistant:

void llvm::report_bad_alloc_error(const char *Reason, bool GenCrashDiag) {
  fatal_error_handler_t Handler = nullptr;
  void *HandlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(BadAllocErrorHandlerMutex);
#endif
    Handler = BadAllocErrorHandler;
    HandlerData = BadAllocErrorHandlerUserData;
  }

  if (Handler) {
    Handler(HandlerData, Reason, GenCrashDiag);
    llvm_unreachable("bad alloc handler should not return");
  }

#ifdef LLVM_ENABLE_EXCEPTIONS
  // If exceptions are enabled, make OOM in malloc look like OOM in new.
  throw std::bad_alloc();
#else
  // Don't call the normal error handler. It may allocate memory. Directly write
  // an OOM to stderr and abort.
  char OOMMessage[] = "LLVM ERROR: out of memory\n";
  ssize_t written = ::write(2, OOMMessage, strlen(OOMMessage));
  (void)written;
  abort();
#endif
}